

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bool_arg_max.cpp
# Opt level: O1

void bool_arg_max(vec<BoolView> *x,int offset,IntVar *y)

{
  BoolArgMax *this;
  ulong uVar1;
  long lVar2;
  IntView<0> _y;
  vec<BoolView> w;
  vec<BoolView> local_70;
  int local_5c;
  vec<BoolView> local_58;
  IntVar *local_48;
  BoolView local_40;
  
  local_58.sz = 0;
  local_58.cap = 0;
  local_58.data = (BoolView *)0x0;
  local_5c = offset;
  local_48 = y;
  if (x->sz != 0) {
    lVar2 = 8;
    uVar1 = 0;
    do {
      local_40.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_40.s = *(bool *)((long)&(x->data->super_Var).super_Branching._vptr_Branching + lVar2 + 4
                            );
      local_40.v = *(int *)((long)&(x->data->super_Var).super_Branching._vptr_Branching + lVar2);
      vec<BoolView>::push(&local_58,&local_40);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar1 < x->sz);
  }
  this = (BoolArgMax *)operator_new(0x38);
  uVar1 = local_58._0_8_ & 0xffffffff;
  local_70.sz = local_58.sz;
  local_70.cap = local_58.sz;
  local_70.data = (BoolView *)malloc(uVar1 << 4);
  if (uVar1 != 0) {
    lVar2 = 8;
    uVar1 = 0;
    do {
      *(undefined ***)((long)local_70.data + lVar2 + -8) = &PTR_finished_0020fb28;
      *(undefined1 *)
       ((long)&((local_70.data)->super_Var).super_Branching._vptr_Branching + lVar2 + 4) =
           *(undefined1 *)
            ((long)&((local_58.data)->super_Var).super_Branching._vptr_Branching + lVar2 + 4);
      *(undefined4 *)((long)&((local_70.data)->super_Var).super_Branching._vptr_Branching + lVar2) =
           *(undefined4 *)
            ((long)&((local_58.data)->super_Var).super_Branching._vptr_Branching + lVar2);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar1 < local_70.sz);
  }
  _y.a = 1;
  _y.b = 0;
  _y.var = local_48;
  BoolArgMax::BoolArgMax(this,&local_70,local_5c,_y);
  vec<BoolView>::~vec(&local_70);
  vec<BoolView>::~vec(&local_58);
  return;
}

Assistant:

void bool_arg_max(vec<BoolView>& x, int offset, IntVar* y) {
	vec<BoolView> w;
	for (unsigned int i = 0; i < x.size(); i++) {
		w.push(BoolView(x[i]));
	}
	new BoolArgMax(w, offset, IntView<>(y));
}